

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref __thiscall cashew::ValueBuilder::makeFunction(ValueBuilder *this,IString name)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  undefined1 local_28 [8];
  IString name_local;
  
  name_local.str._M_len = name.str._M_len;
  local_28 = (undefined1  [8])this;
  RVar1 = makeRawArray(4);
  r = makeRawString((IString *)&DEFUN);
  pVVar2 = Value::push_back(RVar1.inst,r);
  RVar1 = makeRawString((IString *)local_28);
  pVVar2 = Value::push_back(pVVar2,RVar1);
  RVar1 = makeRawArray(0);
  pVVar2 = Value::push_back(pVVar2,RVar1);
  RVar1 = makeRawArray(0);
  RVar1.inst = Value::push_back(pVVar2,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeFunction(IString name) {
    return &makeRawArray(4)
              ->push_back(makeRawString(DEFUN))
              .push_back(makeRawString(name))
              .push_back(makeRawArray())
              .push_back(makeRawArray());
  }